

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O0

void __thiscall RedBlackTree::rotateRight(RedBlackTree *this,Node **ptr)

{
  Node *pNVar1;
  Node *left_child;
  Node **ptr_local;
  RedBlackTree *this_local;
  
  pNVar1 = (*ptr)->left;
  (*ptr)->left = pNVar1->right;
  if ((*ptr)->left != (Node *)0x0) {
    (*ptr)->left->parent = *ptr;
  }
  pNVar1->parent = (*ptr)->parent;
  if ((*ptr)->parent == (Node *)0x0) {
    this->root = pNVar1;
  }
  else if (*ptr == (*ptr)->parent->left) {
    (*ptr)->parent->left = pNVar1;
  }
  else {
    (*ptr)->parent->right = pNVar1;
  }
  pNVar1->right = *ptr;
  (*ptr)->parent = pNVar1;
  return;
}

Assistant:

void RedBlackTree::rotateRight(Node *&ptr) {
    Node *left_child = ptr->left;
    ptr->left = left_child->right;

    if (ptr->left != nullptr) {
        ptr->left->parent = ptr;
    }
    left_child->parent = ptr->parent;

    if (ptr->parent == nullptr) {
        root = left_child;
    } else if (ptr == ptr->parent->left) {
        ptr->parent->left = left_child;
    } else {
        ptr->parent->right = left_child;
    }

    left_child->right = ptr;
    ptr->parent = left_child;
}